

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CharSet<char16_t>::ToComplement
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *result)

{
  size_t sVar1;
  CharSetNode *pCVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  Char lc;
  uint index;
  
  if ((this->rep).compact.countPlusOne - 1 < 5) {
    Sort(this);
    if (4 < (this->rep).compact.countPlusOne - 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x1ef,"(IsCompact())","IsCompact()");
      if (!bVar4) goto LAB_00e70704;
      *puVar7 = 0;
    }
    sVar1 = (this->rep).compact.countPlusOne;
    if ((int)sVar1 != 1) {
      index = 0;
      uVar5 = GetCompactCharU(this,0);
      if (uVar5 != 0) {
        uVar5 = GetCompactCharU(this,0);
        if (0xffff < uVar5 - 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                             ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
          if (!bVar4) goto LAB_00e70704;
          *puVar7 = 0;
        }
        SetRange(result,allocator,L'\0',(Char)(uVar5 - 1));
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      while( true ) {
        if (4 < (this->rep).compact.countPlusOne - 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x1ef,"(IsCompact())","IsCompact()");
          if (!bVar4) goto LAB_00e70704;
          *puVar7 = 0;
        }
        sVar1 = (this->rep).compact.countPlusOne;
        if ((int)sVar1 - 2U <= index) break;
        uVar5 = GetCompactCharU(this,index);
        if (0xffff < uVar5 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                             ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
          if (!bVar4) goto LAB_00e70704;
          *puVar7 = 0;
        }
        index = index + 1;
        uVar6 = GetCompactCharU(this,index);
        if (0xffff < uVar6 - 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                             ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
          if (!bVar4) goto LAB_00e70704;
          *puVar7 = 0;
        }
        SetRange(result,allocator,(Char)(uVar5 + 1),(Char)(uVar6 - 1));
      }
      if (4 < sVar1 - 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x1ef,"(IsCompact())","IsCompact()");
        if (!bVar4) goto LAB_00e70704;
        *puVar7 = 0;
      }
      uVar5 = GetCompactCharU(this,*(int *)&this->rep - 2);
      if (0xfffe < uVar5) {
        return;
      }
      if (4 < (this->rep).compact.countPlusOne - 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x1ef,"(IsCompact())","IsCompact()");
        if (!bVar4) goto LAB_00e70704;
        *puVar7 = 0;
      }
      uVar5 = GetCompactCharU(this,*(int *)&this->rep - 2);
      if (0xffff < uVar5 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                           ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
        if (!bVar4) goto LAB_00e70704;
        *puVar7 = 0;
      }
      lc = (Char)(uVar5 + 1);
      goto LAB_00e706ec;
    }
    if (4 < sVar1 - 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x1ef,"(IsCompact())","IsCompact()");
      if (!bVar4) {
LAB_00e70704:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    if (*(int *)&this->rep != 1) {
      return;
    }
    lc = L'\0';
  }
  else {
    CharBitvec::ToComplement<char16_t>(&(this->rep).full.direct,allocator,0,result);
    pCVar2 = (this->rep).full.root;
    if (pCVar2 != (CharSetNode *)0x0) {
      (*pCVar2->_vptr_CharSetNode[6])(pCVar2,allocator,2,0,result);
      return;
    }
    lc = L'Ā';
  }
LAB_00e706ec:
  SetRange(result,allocator,lc,L'\xffff');
  return;
}

Assistant:

void CharSet<char16>::ToComplement(ArenaAllocator* allocator, CharSet<Char>& result)
    {
        if (IsCompact())
        {
            Sort();
            if (this->GetCompactLength() > 0)
            {
                if (this->GetCompactCharU(0) > 0)
                    result.SetRange(allocator, UTC(0), UTC(this->GetCompactCharU(0) - 1));
                for (uint i = 0; i < this->GetCompactLength() - 1; i++)
                {
                    result.SetRange(allocator, UTC(this->GetCompactCharU(i) + 1), UTC(this->GetCompactCharU(i + 1) - 1));
                }
                if (this->GetCompactCharU(this->GetCompactLength() - 1) < MaxUChar)
                {
                    result.SetRange(allocator, UTC(this->GetCompactCharU(this->GetCompactLength() - 1) + 1), UTC(MaxUChar));
                }
            }
            else if (this->GetCompactLength() == 0)
            {
                result.SetRange(allocator, UTC(0), UTC(MaxUChar));
            }
        }
        else
        {
            rep.full.direct.ToComplement<char16>(allocator, 0, result);
            if (rep.full.root == nullptr)
                result.SetRange(allocator, UTC(CharSetNode::directSize), MaxChar);
            else
                rep.full.root->ToComplement(allocator, CharSetNode::levels - 1, 0, result);
        }
    }